

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

TProb<double> * __thiscall libDAI::TProb<double>::operator/=(TProb<double> *this,TProb<double> *q)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  double dVar6;
  
  pdVar2 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (q->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 < (ulong)((long)pdVar3 - (long)pdVar2 >> 3); uVar5 = uVar5 + 1) {
    dVar1 = pdVar4[uVar5];
    dVar6 = 0.0;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar6 = pdVar2[uVar5] / dVar1;
    }
    pdVar2[uVar5] = dVar6;
  }
  return this;
}

Assistant:

TProb<T>& operator/= (const TProb<T> & q) {
#ifdef DEBUG
                assert( size() == q.size() );
#endif
                for( size_t i = 0; i < size(); i++ ) {
#ifdef DEBUG
    //              assert( q[i] != 0.0 );
#endif
                    if( q[i] == 0.0 )       // FIXME
                        _p[i] = 0.0;
                    else
                        _p[i] /= q[i];
                }
                return *this;
            }